

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O3

bool camp::test::array::get_rvalue_reference(void)

{
  return true;
}

Assistant:

CAMP_TEST_BEGIN(array, get_rvalue_reference)
{
   camp::array<int, 2> a = {1, 8};
   int&& a0 = camp::get<0>(camp::move(a));

   const camp::array<int, 2> b{6, 8};
   const int&& b1 = camp::get<1>(camp::move(b));

   return a0 == 1 &&
          b1 == 8;
}